

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::processSources(MakefileGenerator *this)

{
  QMakeProject *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QStringView config;
  QArrayData *local_48;
  storage_type_conflict *local_40;
  qsizetype local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->project;
  QVar2.m_data = (storage_type *)0x18;
  QVar2.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar2);
  config.m_data = local_40;
  config.m_size = local_38;
  bVar1 = QMakeEvaluator::isActiveConfig(&this_00->super_QMakeEvaluator,config,false);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  if (!bVar1) {
    filterIncludedFiles(this,"SOURCES");
    filterIncludedFiles(this,"GENERATED_SOURCES");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void MakefileGenerator::processSources()
{
    if (project->isActiveConfig("compile_included_sources"))
        return;

    filterIncludedFiles("SOURCES");
    filterIncludedFiles("GENERATED_SOURCES");
}